

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O0

size_t ListFile_GetNextLine(void *pvListFile,char *szBuffer,size_t nMaxChars)

{
  size_t nLength;
  char *szLineEnd;
  char *szLineBegin;
  size_t nMaxChars_local;
  char *szBuffer_local;
  void *pvListFile_local;
  
  szLineEnd = (char *)0x0;
  nLength = 0;
  szLineBegin = (char *)nMaxChars;
  nMaxChars_local = (size_t)szBuffer;
  szBuffer_local = (char *)pvListFile;
  pvListFile_local = (void *)ListFile_GetNextLine(pvListFile,&szLineEnd,(char **)&nLength);
  if (szLineBegin < pvListFile_local) {
    SetLastError(0x69);
    pvListFile_local = (void *)0x0;
  }
  else {
    memcpy((void *)nMaxChars_local,szLineEnd,(size_t)pvListFile_local);
    *(char *)((long)pvListFile_local + nMaxChars_local) = '\0';
  }
  return (size_t)pvListFile_local;
}

Assistant:

size_t ListFile_GetNextLine(void * pvListFile, char * szBuffer, size_t nMaxChars)
{
    const char * szLineBegin = NULL;
    const char * szLineEnd = NULL;
    size_t nLength;

    // Retrieve the next line
    nLength = ListFile_GetNextLine(pvListFile, &szLineBegin, &szLineEnd);

    // Check the length
    if(nLength > nMaxChars)
    {
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return 0;
    }

    // Copy the line to the user buffer
    memcpy(szBuffer, szLineBegin, nLength);
    szBuffer[nLength] = 0;
    return nLength;
}